

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O2

void Res_WinMarkPaths(Res_Win_t *p)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (iVar2 = 0; iVar2 < p->vLeaves->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,iVar2);
    Abc_NodeSetTravIdCurrent(pAVar1);
  }
  for (iVar2 = 0; iVar2 < p->vRoots->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,iVar2);
    Res_WinMarkPaths_rec(pAVar1,p->pNode,p->nLevTravMin);
  }
  return;
}

Assistant:

void Res_WinMarkPaths( Res_Win_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // mark the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    // traverse from the roots and mark the nodes that can reach leaves
    // the nodes that do not reach leaves have previous trav ID
    // the nodes that reach leaves have current trav ID
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Res_WinMarkPaths_rec( pObj, p->pNode, p->nLevTravMin );
}